

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

vec<4U,_float> * __thiscall
basisu::vec<4u,float>::set<3u,float>(vec<4u,float> *this,vec<3U,_float> *other)

{
  long lVar1;
  float fVar2;
  
  if ((vec<4u,float> *)other != this) {
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      fVar2 = vec<3U,_float>::operator[](other,(uint32_t)lVar1);
      *(float *)(this + lVar1 * 4) = fVar2;
    }
    *(undefined4 *)(this + 0xc) = 0;
  }
  return (vec<4U,_float> *)this;
}

Assistant:

inline vec &set(const vec<OtherN, OtherT> &other)
		{
			uint32_t i;
			if ((const void *)(&other) == (const void *)(this))
				return *this;
			const uint32_t m = minimum(OtherN, N);
			for (i = 0; i < m; i++)
				m_v[i] = static_cast<T>(other[i]);
			for (; i < N; i++)
				m_v[i] = 0;
			return *this;
		}